

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_script.cpp
# Opt level: O1

int CfdGetTapBranchCount(void *handle,void *tree_handle,uint32_t *branch_count)

{
  long *plVar1;
  TapBranch *this;
  ulong uVar2;
  string local_40;
  
  cfd::Initialize();
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"TapscriptTree","");
  cfd::capi::CheckBuffer(tree_handle,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  plVar1 = *(long **)((long)tree_handle + 0x18);
  if (*plVar1 == plVar1[1]) {
    this = (TapBranch *)**(undefined8 **)((long)tree_handle + 0x10);
    if ((TapBranch *)(*(undefined8 **)((long)tree_handle + 0x10))[1] == this) {
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0);
    }
    cfd::core::TapBranch::GetBranchList
              ((vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_> *)&local_40,this
              );
  }
  else {
    if ((TapBranch *)plVar1[1] == (TapBranch *)*plVar1) {
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0);
    }
    cfd::core::TapBranch::GetBranchList
              ((vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_> *)&local_40,
               (TapBranch *)*plVar1);
  }
  uVar2 = local_40._M_string_length - (long)local_40._M_dataplus._M_p;
  std::vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>::~vector
            ((vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_> *)&local_40);
  if (branch_count != (uint32_t *)0x0) {
    *branch_count = (int)(uVar2 >> 3) * -0x11111111;
  }
  return 0;
}

Assistant:

int CfdGetTapBranchCount(
    void* handle, void* tree_handle, uint32_t* branch_count) {
  int result = CfdErrorCode::kCfdUnknownError;
  try {
    cfd::Initialize();
    CheckBuffer(tree_handle, kPrefixTapscriptTree);
    CfdCapiTapscriptTree* buffer =
        static_cast<CfdCapiTapscriptTree*>(tree_handle);
    uint32_t count;
    if (!buffer->branch_buffer->empty()) {
      count = static_cast<uint32_t>(
          buffer->branch_buffer->at(0).GetBranchList().size());
    } else {
      count = static_cast<uint32_t>(
          buffer->tree_buffer->at(0).GetBranchList().size());
    }

    if (branch_count != nullptr) *branch_count = count;
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  return result;
}